

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O1

char * jieba_lookup_tag(jieba_t *handle,char *str)

{
  char *pcVar1;
  string tag;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_58,str,&local_59);
  cppjieba::PosTagger::LookupTag
            (&local_38,(PosTagger *)(handle + 0x3f0),&local_58,(SegmentTagged *)(handle + 0x310));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  pcVar1 = strdup(local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return pcVar1;
}

Assistant:

char* jieba_lookup_tag(jieba_t* handle, const char* str) {
  std::string tag = ((cppjieba::Jieba*)handle)->LookupTag(str);
  return strdup(tag.c_str());
}